

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O0

void __thiscall QListView::setModelColumn(QListView *this,int column)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  QListViewPrivate *pQVar3;
  ulong uVar4;
  ModelChangeType in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QListViewPrivate *d;
  QAccessibleTableModelChangeEvent event;
  ModelChangeType in_stack_ffffffffffffff84;
  uint7 in_stack_ffffffffffffff90;
  undefined1 uVar5;
  QPersistentModelIndex local_50 [3];
  QAccessibleTableModelChangeEvent local_38 [48];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QListView *)0x87f4a4);
  uVar5 = true;
  if (-1 < (int)in_ESI) {
    pQVar1 = (pQVar3->super_QAbstractItemViewPrivate).model;
    in_stack_ffffffffffffff84 = in_ESI;
    QPersistentModelIndex::operator_cast_to_QModelIndex(local_50);
    iVar2 = (**(code **)(*(long *)pQVar1 + 0x80))(pQVar1,local_50);
    uVar5 = iVar2 <= (int)in_stack_ffffffffffffff84;
  }
  if ((bool)uVar5 == false) {
    pQVar3->column = in_ESI;
    QAbstractItemViewPrivate::doDelayedItemsLayout
              ((QAbstractItemViewPrivate *)(ulong)in_stack_ffffffffffffff90,
               (int)((ulong)in_RDI >> 0x20));
    uVar4 = QAccessible::isActive();
    if ((uVar4 & 1) != 0) {
      memset(local_38,0xaa,0x30);
      QAccessibleTableModelChangeEvent::QAccessibleTableModelChangeEvent
                ((QAccessibleTableModelChangeEvent *)CONCAT17(uVar5,in_stack_ffffffffffffff90),
                 in_RDI,in_stack_ffffffffffffff84);
      QAccessible::updateAccessibility((QAccessibleEvent *)local_38);
      QAccessibleTableModelChangeEvent::~QAccessibleTableModelChangeEvent(local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QListView::setModelColumn(int column)
{
    Q_D(QListView);
    if (column < 0 || column >= d->model->columnCount(d->root))
        return;
    d->column = column;
    d->doDelayedItemsLayout();
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        QAccessibleTableModelChangeEvent event(this, QAccessibleTableModelChangeEvent::ModelReset);
        QAccessible::updateAccessibility(&event);
    }
#endif
}